

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geometry.c
# Opt level: O2

geometry_t new_submesh_geometry(scene *scene,mesh *mesh,size_t begin,size_t end)

{
  geometry_t pgVar1;
  submesh_geometry submesh_geometry;
  
  submesh_geometry.geometry.node.type = SUBMESH_GEOMETRY;
  submesh_geometry.geometry.node.hash = hash_submesh_geometry;
  submesh_geometry.geometry.node.compare = compare_submesh_geometry;
  submesh_geometry.geometry.node.cleanup = cleanup_submesh_geometry;
  submesh_geometry.geometry.prepare = prepare_submesh_geometry;
  submesh_geometry.geometry.intersect_ray = intersect_submesh_geometry_ray;
  submesh_geometry.geometry.get_attr = get_submesh_geometry_attr;
  submesh_geometry.geometry.sample_surface = sample_submesh_geometry_surface;
  submesh_geometry.geometry.get_surface_area = get_submesh_geometry_surface_area;
  submesh_geometry.accel = (accel *)0x0;
  submesh_geometry.mesh = mesh;
  submesh_geometry.begin = begin;
  submesh_geometry.end = end;
  pgVar1 = (geometry_t)insert_scene_node(scene,(scene_node *)&submesh_geometry,0x68);
  return pgVar1;
}

Assistant:

geometry_t new_submesh_geometry(struct scene* scene, const struct mesh* mesh, size_t begin, size_t end) {
    struct submesh_geometry submesh_geometry = {
        .geometry = {
            .node = {
                .type    = SUBMESH_GEOMETRY,
                .hash    = hash_submesh_geometry,
                .compare = compare_submesh_geometry,
                .cleanup = cleanup_submesh_geometry
            },
            .prepare          = prepare_submesh_geometry,
            .intersect_ray    = intersect_submesh_geometry_ray,
            .get_attr         = get_submesh_geometry_attr,
            .sample_surface   = sample_submesh_geometry_surface,
            .get_surface_area = get_submesh_geometry_surface_area
        },
        .mesh = mesh,
        .begin = begin,
        .end = end
    };
    return (geometry_t)insert_scene_node(scene,
        &submesh_geometry.geometry.node,
        sizeof(submesh_geometry));
}